

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigWin.c
# Opt level: O3

int Aig_ManFindCut_int(Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited,int nSizeLimit,int nFanoutLimit)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  void **ppvVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  
  uVar1 = vFront->nSize;
  if (0 < (long)(int)uVar1) {
    uVar6 = 100;
    lVar9 = 0;
    pvVar11 = (void *)0x0;
    do {
      pvVar10 = vFront->pArray[lVar9];
      uVar3 = *(ulong *)((long)pvVar10 + 0x18);
      if ((uVar3 & 0x10) == 0) {
        __assert_fail("pNode->fMarkA",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                      ,0x32,"int Aig_NodeGetLeafCostOne(Aig_Obj_t *, int)");
      }
      uVar8 = 999;
      if (((((uint)uVar3 & 7) != 2) &&
          (uVar8 = (uint)((*(byte *)((*(ulong *)((long)pvVar10 + 0x10) & 0xfffffffffffffffe) + 0x18)
                          & 0x10) == 0) +
                   (uint)((*(byte *)((*(ulong *)((long)pvVar10 + 8) & 0xfffffffffffffffe) + 0x18) &
                          0x10) == 0), 1 < uVar8)) &&
         (nFanoutLimit < (int)((uint)(uVar3 >> 6) & 0x3ffffff))) {
        uVar8 = 999;
      }
      if (((uVar8 < uVar6) ||
          ((uVar6 == uVar8 &&
           ((*(uint *)((long)pvVar11 + 0x1c) & 0xffffff) < ((uint)(uVar3 >> 0x20) & 0xffffff))))) &&
         (pvVar11 = pvVar10, uVar6 = uVar8, uVar8 == 0)) {
        uVar6 = 0;
        goto LAB_0064e49d;
      }
      pvVar10 = pvVar11;
      lVar9 = lVar9 + 1;
      pvVar11 = pvVar10;
    } while ((int)uVar1 != lVar9);
    if (pvVar10 != (void *)0x0) {
      if (2 < uVar6) {
        __assert_fail("CostBest < 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                      ,0x67,"int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
      }
LAB_0064e49d:
      if ((int)(uVar6 + uVar1 + -1) <= nSizeLimit) {
        if ((*(uint *)((long)pvVar10 + 0x18) & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pFaninBest)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                        ,0x6a,"int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
        }
        lVar9 = (ulong)uVar1 + 1;
        do {
          if ((int)lVar9 + -1 < 1) {
            __assert_fail("i >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
          }
          lVar7 = lVar9 + -1;
          lVar4 = lVar9 + -2;
          lVar9 = lVar7;
        } while (vFront->pArray[lVar4] != pvVar10);
        for (; (int)lVar7 < (int)uVar1; lVar7 = lVar7 + 1) {
          vFront->pArray[lVar7 + -1] = vFront->pArray[lVar7];
        }
        vFront->nSize = uVar1 - 1;
        pvVar11 = (void *)(*(ulong *)((long)pvVar10 + 8) & 0xfffffffffffffffe);
        if ((*(ulong *)((long)pvVar11 + 0x18) & 0x10) == 0) {
          *(ulong *)((long)pvVar11 + 0x18) = *(ulong *)((long)pvVar11 + 0x18) | 0x10;
          uVar1 = vFront->nSize;
          if (uVar1 == vFront->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vFront->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(vFront->pArray,0x80);
              }
              vFront->pArray = ppvVar5;
              vFront->nCap = 0x10;
            }
            else {
              if (vFront->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar5 = (void **)realloc(vFront->pArray,(ulong)uVar1 << 4);
              }
              vFront->pArray = ppvVar5;
              vFront->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar5 = vFront->pArray;
          }
          iVar2 = vFront->nSize;
          vFront->nSize = iVar2 + 1;
          ppvVar5[iVar2] = pvVar11;
          uVar1 = vVisited->nSize;
          if (uVar1 == vVisited->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vVisited->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(vVisited->pArray,0x80);
              }
              vVisited->pArray = ppvVar5;
              vVisited->nCap = 0x10;
            }
            else {
              if (vVisited->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar5 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
              }
              vVisited->pArray = ppvVar5;
              vVisited->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar5 = vVisited->pArray;
          }
          iVar2 = vVisited->nSize;
          vVisited->nSize = iVar2 + 1;
          ppvVar5[iVar2] = pvVar11;
        }
        pvVar11 = (void *)(*(ulong *)((long)pvVar10 + 0x10) & 0xfffffffffffffffe);
        if ((*(ulong *)((long)pvVar11 + 0x18) & 0x10) == 0) {
          *(ulong *)((long)pvVar11 + 0x18) = *(ulong *)((long)pvVar11 + 0x18) | 0x10;
          uVar1 = vFront->nSize;
          if (uVar1 == vFront->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vFront->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(vFront->pArray,0x80);
              }
              vFront->pArray = ppvVar5;
              vFront->nCap = 0x10;
            }
            else {
              if (vFront->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar5 = (void **)realloc(vFront->pArray,(ulong)uVar1 << 4);
              }
              vFront->pArray = ppvVar5;
              vFront->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar5 = vFront->pArray;
          }
          iVar2 = vFront->nSize;
          vFront->nSize = iVar2 + 1;
          ppvVar5[iVar2] = pvVar11;
          uVar1 = vVisited->nSize;
          if (uVar1 == vVisited->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vVisited->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(vVisited->pArray,0x80);
              }
              vVisited->pArray = ppvVar5;
              vVisited->nCap = 0x10;
            }
            else {
              if (vVisited->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar5 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
              }
              vVisited->pArray = ppvVar5;
              vVisited->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar5 = vVisited->pArray;
          }
          iVar2 = vVisited->nSize;
          vVisited->nSize = iVar2 + 1;
          ppvVar5[iVar2] = pvVar11;
        }
        if (vFront->nSize <= nSizeLimit) {
          return 1;
        }
        __assert_fail("Vec_PtrSize(vFront) <= nSizeLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                      ,0x81,"int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
      }
    }
  }
  return 0;
}

Assistant:

int Aig_ManFindCut_int( Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited, int nSizeLimit, int nFanoutLimit )
{
    Aig_Obj_t * pNode, * pFaninBest, * pNext;
    int CostBest, CostCur, i;
    // find the best fanin
    CostBest   = 100;
    pFaninBest = NULL;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_PtrForEachEntry( Aig_Obj_t *, vFront, pNode, i )
    {
        CostCur = Aig_NodeGetLeafCostOne( pNode, nFanoutLimit );
//printf( "    Fanin %s has cost %d.\n", Aig_ObjName(pNode), CostCur );
        if ( CostBest > CostCur ||
            (CostBest == CostCur && pNode->Level > pFaninBest->Level) )
        {
            CostBest   = CostCur;
            pFaninBest = pNode;
        }
        if ( CostBest == 0 )
            break;
    }
    if ( pFaninBest == NULL )
        return 0;
    assert( CostBest < 3 );
    if ( Vec_PtrSize(vFront) - 1 + CostBest > nSizeLimit )
        return 0;
    assert( Aig_ObjIsNode(pFaninBest) );
    // remove the node from the array
    Vec_PtrRemove( vFront, pFaninBest );
//printf( "Removing fanin %s.\n", Aig_ObjName(pFaninBest) );

    // add the left child to the fanins
    pNext = Aig_ObjFanin0(pFaninBest);
    if ( !pNext->fMarkA )
    {
//printf( "Adding fanin %s.\n", Aig_ObjName(pNext) );
        pNext->fMarkA = 1;
        Vec_PtrPush( vFront, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    // add the right child to the fanins
    pNext = Aig_ObjFanin1(pFaninBest);
    if ( !pNext->fMarkA )
    {
//printf( "Adding fanin %s.\n", Aig_ObjName(pNext) );
        pNext->fMarkA = 1;
        Vec_PtrPush( vFront, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    assert( Vec_PtrSize(vFront) <= nSizeLimit );
    // keep doing this
    return 1;
}